

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void float_invalid_op_div(CPUPPCState_conflict *env,_Bool set_fprc,uintptr_t retaddr,int classes)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if ((classes & 0xffffffbfU) == 2) {
    uVar2 = env->fpscr;
    uVar4 = uVar2 & 0xfff9ffff | 0x200000;
    uVar3 = uVar2 & 0xfff80f7f | 0x211000;
    if (!set_fprc) {
      uVar3 = uVar4;
    }
    if ((char)uVar2 < '\0') {
      uVar3 = uVar4;
    }
    env->fpscr = uVar3;
    finish_invalid_op_excp(env,8,retaddr);
    return;
  }
  if ((classes & 0xffffffbfU) == 8) {
    uVar2 = env->fpscr;
    uVar4 = uVar2 & 0xfff9ffff | 0x400000;
    uVar3 = uVar2 & 0xfff80f7f | 0x411000;
    if (!set_fprc) {
      uVar3 = uVar4;
    }
    if ((char)uVar2 < '\0') {
      uVar3 = uVar4;
    }
    env->fpscr = uVar3;
    finish_invalid_op_excp(env,7,retaddr);
    return;
  }
  if ((classes & 0x20U) == 0) {
    return;
  }
  pbVar1 = (byte *)((long)&env->fpscr + 3);
  *pbVar1 = *pbVar1 | 1;
  finish_invalid_op_excp(env,5,retaddr);
  return;
}

Assistant:

static void float_invalid_op_div(CPUPPCState *env, bool set_fprc,
                                 uintptr_t retaddr, int classes)
{
    classes &= ~is_neg;
    if (classes == is_inf) {
        /* Division of infinity by infinity */
        float_invalid_op_vxidi(env, set_fprc, retaddr);
    } else if (classes == is_zero) {
        /* Division of zero by zero */
        float_invalid_op_vxzdz(env, set_fprc, retaddr);
    } else if (classes & is_snan) {
        float_invalid_op_vxsnan(env, retaddr);
    }
}